

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O3

uint8_t u_getCombiningClass_63(UChar32 c)

{
  uint in_EAX;
  int iVar1;
  Norm2AllModes *pNVar2;
  DecomposeNormalizer2 *pDVar3;
  UErrorCode errorCode;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  pNVar2 = icu_63::Norm2AllModes::getNFCInstance((UErrorCode *)((long)&uStack_18 + 4));
  if (0 < uStack_18._4_4_) {
    return '\0';
  }
  pDVar3 = &pNVar2->decomp;
  if (pNVar2 == (Norm2AllModes *)0x0) {
    pDVar3 = (DecomposeNormalizer2 *)0x0;
  }
  iVar1 = (*(pDVar3->super_Normalizer2WithImpl).super_Normalizer2.super_UObject._vptr_UObject[10])
                    (pDVar3,c);
  return (uint8_t)iVar1;
}

Assistant:

U_CAPI uint8_t U_EXPORT2
u_getCombiningClass(UChar32 c) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *nfd=Normalizer2::getNFDInstance(errorCode);
    if(U_SUCCESS(errorCode)) {
        return nfd->getCombiningClass(c);
    } else {
        return 0;
    }
}